

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_parameterization_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::PointCloudParameterizationQuantity::createProgram
          (PointCloudParameterizationQuantity *this)

{
  PointCloud *pPVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  ShaderProgram *program;
  Engine *pEVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  long lVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator_type local_1b9;
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pEVar4 = render::engine;
  switch((this->vizStyle).value) {
  case CHECKER:
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"RAYCAST_SPHERE","");
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"SPHERE_PROPAGATE_VALUE2","");
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"SHADE_CHECKER_VALUE2","");
    __l._M_len = 2;
    __l._M_array = &local_170;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a8,__l,&local_1b9);
    PointCloud::addStructureRules(&local_188,pPVar1,&local_a8);
    (*pEVar4->_vptr_Engine[0x23])(&local_1b8,pEVar4,local_1a8,&local_188,0);
    p_Var5 = p_Stack_1b0;
    peVar3 = local_1b8;
    local_1b8 = (element_type *)0x0;
    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    lVar8 = 0;
    do {
      if (local_140 + lVar8 != *(undefined1 **)((long)local_150 + lVar8)) {
        operator_delete(*(undefined1 **)((long)local_150 + lVar8));
      }
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x40);
    break;
  case GRID:
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"RAYCAST_SPHERE","");
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"SPHERE_PROPAGATE_VALUE2","");
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"SHADE_GRID_VALUE2","");
    __l_02._M_len = 2;
    __l_02._M_array = &local_170;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c0,__l_02,&local_1b9);
    PointCloud::addStructureRules(&local_188,pPVar1,&local_c0);
    (*pEVar4->_vptr_Engine[0x23])(&local_1b8,pEVar4,local_1a8,&local_188,0);
    p_Var5 = p_Stack_1b0;
    peVar3 = local_1b8;
    local_1b8 = (element_type *)0x0;
    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    lVar8 = 0;
    do {
      if (local_140 + lVar8 != *(undefined1 **)((long)local_150 + lVar8)) {
        operator_delete(*(undefined1 **)((long)local_150 + lVar8));
      }
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x40);
    break;
  case LOCAL_CHECK:
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"RAYCAST_SPHERE","");
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"SPHERE_PROPAGATE_VALUE2","");
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"SHADE_COLORMAP_ANGULAR2","");
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"CHECKER_VALUE2COLOR","");
    __l_00._M_len = 3;
    __l_00._M_array = &local_170;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_d8,__l_00,&local_1b9);
    PointCloud::addStructureRules(&local_188,pPVar1,&local_d8);
    (*pEVar4->_vptr_Engine[0x23])(&local_1b8,pEVar4,local_1a8,&local_188,0);
    p_Var5 = p_Stack_1b0;
    peVar3 = local_1b8;
    local_1b8 = (element_type *)0x0;
    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    lVar8 = 0;
    do {
      if (local_120 + lVar8 != *(undefined1 **)((long)local_130 + lVar8)) {
        operator_delete(*(undefined1 **)((long)local_130 + lVar8));
      }
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x60);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0]);
    }
    peVar3 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    puVar7 = local_40;
    local_50[0] = puVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"t_colormap","");
    (*peVar3->_vptr_ShaderProgram[0x19])(peVar3,(string *)local_50,&(this->cMap).value,0);
    puVar6 = local_50[0];
    goto LAB_001e65a1;
  case LOCAL_RAD:
    local_1a8[0] = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"RAYCAST_SPHERE","");
    pPVar1 = (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_170,"SPHERE_PROPAGATE_VALUE2","");
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_150,"SHADE_COLORMAP_ANGULAR2","");
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"SHADEVALUE_MAG_VALUE2","");
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_110,"ISOLINE_STRIPE_VALUECOLOR","");
    __l_01._M_len = 4;
    __l_01._M_array = &local_170;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f0,__l_01,&local_1b9);
    PointCloud::addStructureRules(&local_188,pPVar1,&local_f0);
    (*pEVar4->_vptr_Engine[0x23])(&local_1b8,pEVar4,local_1a8,&local_188,0);
    p_Var5 = p_Stack_1b0;
    peVar3 = local_1b8;
    local_1b8 = (element_type *)0x0;
    p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0);
    lVar8 = 0;
    do {
      if (local_100 + lVar8 != *(undefined1 **)((long)local_110 + lVar8)) {
        operator_delete(*(undefined1 **)((long)local_110 + lVar8));
      }
      lVar8 = lVar8 + -0x20;
    } while (lVar8 != -0x80);
    if (local_1a8[0] != local_198) {
      operator_delete(local_1a8[0]);
    }
    peVar3 = (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    puVar7 = local_60;
    local_70[0] = puVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"t_colormap","");
    (*peVar3->_vptr_ShaderProgram[0x19])(peVar3,(string *)local_70,&(this->cMap).value,0);
    puVar6 = local_70[0];
LAB_001e65a1:
    if (puVar6 == puVar7) goto switchD_001e6082_default;
    goto LAB_001e66ff;
  default:
    goto switchD_001e6082_default;
  }
  puVar6 = local_1a8[0];
  if (local_1a8[0] != local_198) {
LAB_001e66ff:
    operator_delete(puVar6);
  }
switchD_001e6082_default:
  PointCloud::fillGeometryBuffers
            ((this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent,
             (this->program).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  peVar3 = (this->program).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a_value2","");
  (*peVar3->_vptr_ShaderProgram[0xf])(peVar3,(string *)local_90,&this->coords,0,0,0xffffffff);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  pEVar4 = render::engine;
  program = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  PointCloud::getMaterial_abi_cxx11_
            (&local_170,
             (this->super_PointCloudQuantity).super_Quantity<polyscope::PointCloud>.parent);
  render::Engine::setMaterial(pEVar4,program,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PointCloudParameterizationQuantity::createProgram() {
  // Create the program to draw this quantity

  switch (getStyle()) {
  case ParamVizStyle::CHECKER:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_CHECKER_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE", parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_CHECKER_VALUE2"}));
    break;
  case ParamVizStyle::GRID:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_GRID_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader("RAYCAST_SPHERE",
                                            parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_GRID_VALUE2"}));
    break;
  case ParamVizStyle::LOCAL_CHECK:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_LOCAL_CHECKER_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE",
        parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_COLORMAP_ANGULAR2", "CHECKER_VALUE2COLOR"}));
    program->setTextureFromColormap("t_colormap", cMap.get());
    break;
  case ParamVizStyle::LOCAL_RAD:
    // program = render::engine->generateShaderProgram(
    //{render::PARAM_SURFACE_VERT_SHADER, render::PARAM_LOCAL_RAD_SURFACE_FRAG_SHADER}, DrawMode::Triangles);
    program = render::engine->requestShader(
        "RAYCAST_SPHERE", parent.addStructureRules({"SPHERE_PROPAGATE_VALUE2", "SHADE_COLORMAP_ANGULAR2",
                                                    "SHADEVALUE_MAG_VALUE2", "ISOLINE_STRIPE_VALUECOLOR"}));
    program->setTextureFromColormap("t_colormap", cMap.get());
    break;
  }

  // Fill buffers
  parent.fillGeometryBuffers(*program);
  program->setAttribute("a_value2", coords);

  render::engine->setMaterial(*program, parent.getMaterial());
}